

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::CaseStatement::ItemGroup>::
emplaceRealloc<slang::ast::CaseStatement::ItemGroup>
          (SmallVectorBase<slang::ast::CaseStatement::ItemGroup> *this,pointer pos,ItemGroup *args)

{
  ulong uVar1;
  pointer p;
  size_t sVar2;
  pointer pIVar3;
  long lVar4;
  pointer pIVar5;
  pointer pIVar6;
  long lVar7;
  size_type sVar8;
  ulong uVar9;
  
  if (this->len == 0x555555555555555) {
    detail::throwLengthError();
  }
  uVar9 = this->len + 1;
  uVar1 = this->cap;
  if (uVar9 < uVar1 * 2) {
    uVar9 = uVar1 * 2;
  }
  if (0x555555555555555 - uVar1 < uVar1) {
    uVar9 = 0x555555555555555;
  }
  lVar7 = (long)pos - (long)this->data_;
  pIVar3 = (pointer)operator_new(uVar9 * 0x18);
  *(Statement **)((long)pIVar3 + lVar7 + 0x10) = (args->stmt).ptr;
  sVar2 = (args->expressions)._M_extent._M_extent_value;
  *(undefined8 *)((long)pIVar3 + lVar7) = (args->expressions)._M_ptr;
  ((undefined8 *)((long)pIVar3 + lVar7))[1] = sVar2;
  p = this->data_;
  sVar8 = this->len;
  lVar4 = (long)p + (sVar8 * 0x18 - (long)pos);
  pIVar5 = p;
  pIVar6 = pIVar3;
  if (lVar4 == 0) {
    pIVar5 = pIVar3;
    pIVar6 = p;
    if (sVar8 != 0) {
      do {
        (pIVar5->stmt).ptr = (pIVar6->stmt).ptr;
        sVar2 = (pIVar6->expressions)._M_extent._M_extent_value;
        (pIVar5->expressions)._M_ptr = (pIVar6->expressions)._M_ptr;
        (pIVar5->expressions)._M_extent._M_extent_value = sVar2;
        pIVar6 = pIVar6 + 1;
        pIVar5 = pIVar5 + 1;
      } while (pIVar6 != pos);
    }
  }
  else {
    for (; pIVar5 != pos; pIVar5 = pIVar5 + 1) {
      (pIVar6->stmt).ptr = (pIVar5->stmt).ptr;
      sVar2 = (pIVar5->expressions)._M_extent._M_extent_value;
      (pIVar6->expressions)._M_ptr = (pIVar5->expressions)._M_ptr;
      (pIVar6->expressions)._M_extent._M_extent_value = sVar2;
      pIVar6 = pIVar6 + 1;
    }
    memcpy((void *)((long)pIVar3 + lVar7 + 0x18),pos,((lVar4 - 0x18U) / 0x18) * 0x18 + 0x18);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar8 = this->len;
  }
  this->len = sVar8 + 1;
  this->cap = uVar9;
  this->data_ = pIVar3;
  return (pointer)((long)pIVar3 + lVar7);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}